

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbcursor.cpp
# Opt level: O1

void __thiscall QFbCursor::pointerEvent(QFbCursor *this,QMouseEvent *e)

{
  char cVar1;
  undefined4 uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  undefined1 auVar6 [16];
  double extraout_XMM1_Qa;
  undefined1 auVar7 [16];
  QRect QVar8;
  QRect local_28;
  long local_18;
  
  QVar8._8_8_ = local_28._8_8_;
  QVar8._0_8_ = local_28._0_8_;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(short *)(e + 8) == 5) {
    uVar2 = QEventPoint::globalPosition();
    QVar8.x2.m_i = local_28.x2.m_i;
    QVar8.y2.m_i = local_28.y2.m_i;
    QVar8.x1.m_i = local_28.x1.m_i;
    QVar8.y1.m_i = local_28.y1.m_i;
    auVar7._0_8_ = (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                   extraout_XMM1_Qa;
    auVar7._8_8_ = (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                   extraout_XMM0_Qa;
    auVar7 = minpd(_DAT_001448f0,auVar7);
    auVar6._8_8_ = -(ulong)(-2147483648.0 < auVar7._8_8_);
    auVar6._0_8_ = -(ulong)(-2147483648.0 < auVar7._0_8_);
    uVar3 = movmskpd(uVar2,auVar6);
    uVar5 = 0x8000000000000000;
    if ((uVar3 & 1) != 0) {
      uVar5 = (ulong)(uint)(int)auVar7._0_8_ << 0x20;
    }
    uVar4 = 0x80000000;
    if ((uVar3 & 2) != 0) {
      uVar4 = (ulong)(uint)(int)auVar7._8_8_;
    }
    *(ulong *)(this + 0x58) = uVar4 | uVar5;
    if (this[0x10] == (QFbCursor)0x1) {
      QVar8 = getCurrentRect(this);
      *(QRect *)(this + 0x20) = QVar8;
      if (this[0x41] == (QFbCursor)0x0) {
        local_28 = (QRect)(**(code **)(**(long **)(this + 0x18) + 0x68))();
        (**(code **)(**(long **)(this + 0x18) + 0x68))();
        cVar1 = QRect::intersects(&local_28);
        QVar8 = local_28;
        if (cVar1 == '\0') goto LAB_0011c3de;
      }
      (**(code **)(*(long *)this + 0xa0))(this);
      QVar8 = local_28;
    }
  }
LAB_0011c3de:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  local_28 = QVar8;
  __stack_chk_fail();
}

Assistant:

void QFbCursor::pointerEvent(const QMouseEvent &e)
{
    if (e.type() != QEvent::MouseMove)
        return;
    m_pos = e.globalPosition().toPoint();
    if (!mVisible)
        return;
    mCurrentRect = getCurrentRect();
    if (mOnScreen || mScreen->geometry().intersects(mCurrentRect.translated(mScreen->geometry().topLeft())))
        setDirty();
}